

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int aux_close(lua_State *L)

{
  TValue *pTVar1;
  GCObject *pGVar2;
  int iVar3;
  TValue *pTVar4;
  int iVar5;
  
  pTVar1 = L->top;
  pTVar4 = &luaO_nilobject_;
  if (L->base < pTVar1) {
    pTVar4 = L->base;
  }
  iVar3 = pTVar4->tt;
  if (iVar3 == 8) {
    pGVar2 = (pTVar4->value).gc;
    pTVar1->value = (pGVar2->th).l_gt.value;
    iVar5 = (pGVar2->th).l_gt.tt;
  }
  else if ((iVar3 == 7) || (iVar5 = 0, iVar3 == 6)) {
    pTVar1->value = (Value)(((pTVar4->value).gc)->h).array;
    iVar5 = 5;
  }
  pTVar1->tt = iVar5;
  L->top = L->top + 1;
  lua_getfield(L,-1,"__close");
  iVar3 = (*(code *)((L->top[-1].value.gc)->h).node)(L);
  return iVar3;
}

Assistant:

static int aux_close(lua_State*L){
lua_getfenv(L,1);
lua_getfield(L,-1,"__close");
return(lua_tocfunction(L,-1))(L);
}